

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  CompiledModule *params_1;
  ulong uVar1;
  NodeTranslator *this_00;
  String *pSVar2;
  bool bVar3;
  Which WVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  CompiledModule *params;
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> *__y;
  Own<capnp::compiler::Compiler::Alias,_std::nullptr_t> *__y_00;
  NullableValue<unsigned_long> *pNVar8;
  unsigned_long *puVar9;
  Node *pNVar10;
  size_t sVar11;
  Builder *pBVar12;
  Orphan<capnp::schema::Node> *params_3;
  Exception *params_1_00;
  NullableValue<kj::Exception> *other;
  Exception *pEVar13;
  ErrorReporter *pEVar14;
  Impl *pIVar15;
  Workspace *pWVar16;
  Schema selfBootstrapSchema;
  Array<capnp::schema::Node::Reader> *other_00;
  Array<capnp::schema::Node::SourceInfo::Reader> *other_01;
  State in_EDX;
  anon_class_16_2_c4f18ce5 *func;
  undefined4 in_register_00000034;
  Node *params_00;
  Iterator IVar17;
  Iterator IVar18;
  ArrayPtr<const_char> AVar19;
  NodeSet local_928;
  NodeSet local_8c8;
  Fault local_868;
  Fault f_2;
  undefined1 local_858 [6];
  DebugExpression<bool> _kjCondition_1;
  NodeSet nodeSet;
  undefined1 local_7f0 [40];
  ArrayPtr<const_char> local_7c8;
  Exception *local_7b0;
  Exception *exception;
  Workspace *local_7a0;
  Maybe<kj::Exception> local_798;
  undefined1 local_600 [8];
  NullableValue<kj::Exception> _exception566;
  TemporaryPointer<capnp::schema::Node::NestedNode::Builder> local_460;
  Reader local_438;
  ArrayPtr<const_char> local_408;
  TemporaryPointer<capnp::schema::Node::NestedNode::Builder> local_3f8;
  class_kj__Own_72 local_3d0;
  Node *node;
  Node **__end3_1;
  Node **__begin3_1;
  Vector<capnp::compiler::Compiler::Node_*> *__range3_1;
  uint local_3a8;
  undefined1 local_3a0 [8];
  Iterator nestedIter;
  Builder nestedNodes;
  Node *p;
  Node *_p545;
  unsigned_long *lastColon;
  undefined1 local_340 [8];
  NullableValue<unsigned_long> _lastColon540;
  unsigned_long *lastDot;
  undefined1 local_318 [8];
  NullableValue<unsigned_long> _lastDot537;
  undefined1 local_2f8 [8];
  BuilderFor<capnp::schema::Node> builder;
  Orphan<capnp::schema::Node> schemaNode;
  Workspace *workspace;
  Fault f_1;
  pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_> local_298;
  Reader local_278;
  ArrayPtr<const_char> local_248;
  undefined1 auStack_238 [8];
  StringPtr name_1;
  Reader local_220;
  Reader local_1f0;
  undefined1 local_1c0 [8];
  Own<capnp::compiler::Compiler::Alias,_std::nullptr_t> alias;
  pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_> local_1a8;
  Reader local_188;
  ArrayPtr<const_char> local_158;
  undefined1 auStack_148 [8];
  StringPtr name;
  undefined1 local_130 [8];
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> subNode;
  Reader nestedDecl;
  undefined1 local_e0 [8];
  Iterator __end3;
  undefined1 local_c0 [8];
  Iterator __begin3;
  Reader *__range3;
  Arena *arena;
  undefined1 local_68 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:476:3)>
  _kjDefer476;
  ArrayPtr<const_char> local_50;
  Exception *local_40;
  Content *content;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  State minimumState_local;
  Node *this_local;
  
  params_00 = (Node *)CONCAT44(in_register_00000034,minimumState);
  f.exception._2_1_ = (params_00->isBuiltin ^ 0xffU) & 1;
  f.exception._4_4_ = in_EDX;
  f.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar3 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3))
  ;
  if (!bVar3) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin",
               "_kjCondition,\"illegal method call for built-in declaration\"",
               (DebugExpression<bool> *)((long)&f.exception + 3),
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  local_40 = (Exception *)&params_00->guardedContent;
  bVar3 = Content::stateHasReached((Content *)local_40,f.exception._4_4_);
  if (bVar3) {
    kj::Maybe<capnp::compiler::Compiler::Node::Content_&>::Maybe
              ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)this,(Content *)local_40);
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this;
  }
  if ((params_00->inGetContent & 1U) != 0) {
    kj::StringPtr::StringPtr((StringPtr *)&local_50,"Declaration recursively depends on itself.");
    addError(params_00,(StringPtr)local_50);
    kj::Maybe<capnp::compiler::Compiler::Node::Content_&>::Maybe
              ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)this);
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this;
  }
  params_00->inGetContent = true;
  arena = (Arena *)params_00;
  kj::
  defer<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__0>
            ((kj *)local_68,(Type *)&arena);
  switch(*(undefined4 *)&(local_40->ownFile).content.ptr) {
  case 0:
    if ((int)f.exception._4_4_ < 1) goto switchD_006d7388_default;
    pIVar15 = CompiledModule::getCompiler(params_00->module);
    params = (CompiledModule *)Compiler::Impl::getNodeArena(pIVar15);
    Declaration::Reader::getNestedDecls((Reader *)&__begin3.index,&params_00->declaration);
    IVar17 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin
                       ((Reader *)&__begin3.index);
    __end3._8_8_ = IVar17.container;
    __begin3.container._0_4_ = IVar17.index;
    local_c0 = (undefined1  [8])__end3._8_8_;
    IVar17 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end
                       ((Reader *)&__begin3.index);
    local_e0 = (undefined1  [8])IVar17.container;
    __end3.container._0_4_ = IVar17.index;
    while( true ) {
      bVar3 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
              ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                            *)local_c0,
                           (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                            *)local_e0);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
      ::operator*((Reader *)&subNode.ptr,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                   *)local_c0);
      WVar4 = Declaration::Reader::which((Reader *)&subNode.ptr);
      uVar6 = (uint)WVar4;
      if (WVar4 == FILE) {
LAB_006d75a5:
        kj::Arena::
        allocateOwn<capnp::compiler::Compiler::Node,capnp::compiler::Compiler::Node&,capnp::compiler::Declaration::Reader&>
                  ((Arena *)local_130,(Node *)params,(Reader *)params_00);
        Declaration::Reader::getName(&local_188,(Reader *)&subNode.ptr);
        AVar19 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_188);
        name.content.ptr = (char *)AVar19.size_;
        auStack_148 = (undefined1  [8])AVar19.ptr;
        local_158 = AVar19;
        kj::Vector<capnp::compiler::Compiler::Node*>::
        add<kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>&>
                  ((Vector<capnp::compiler::Compiler::Node*> *)
                   &(local_40->description).content.disposer,
                   (Own<capnp::compiler::Compiler::Node,_std::nullptr_t> *)local_130);
        pSVar2 = &local_40->ownFile;
        __y = kj::mv<kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>
                        ((Own<capnp::compiler::Compiler::Node,_std::nullptr_t> *)local_130);
        std::make_pair<kj::StringPtr&,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>
                  (&local_1a8,(StringPtr *)auStack_148,__y);
        alias.ptr = (Alias *)std::
                             multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
                             ::
                             insert<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>
                                       ((multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
                                         *)&(pSVar2->content).size_,&local_1a8);
        std::pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>::~pair
                  (&local_1a8);
        kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::~Own
                  ((Own<capnp::compiler::Compiler::Node,_std::nullptr_t> *)local_130);
      }
      else if (uVar6 == 1) {
        params_1 = params_00->module;
        Declaration::Reader::getUsing(&local_220,(Reader *)&subNode.ptr);
        Declaration::Using::Reader::getTarget(&local_1f0,&local_220);
        kj::Arena::
        allocateOwn<capnp::compiler::Compiler::Alias,capnp::compiler::Compiler::CompiledModule&,capnp::compiler::Compiler::Node&,capnp::compiler::Expression::Reader>
                  ((Arena *)local_1c0,params,(Node *)params_1,(Reader *)params_00);
        Declaration::Reader::getName(&local_278,(Reader *)&subNode.ptr);
        AVar19 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_278);
        name_1.content.ptr = (char *)AVar19.size_;
        auStack_238 = (undefined1  [8])AVar19.ptr;
        pSVar2 = &local_40->remoteTrace;
        local_248 = AVar19;
        __y_00 = kj::mv<kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>
                           ((Own<capnp::compiler::Compiler::Alias,_std::nullptr_t> *)local_1c0);
        std::make_pair<kj::StringPtr&,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>
                  (&local_298,(StringPtr *)auStack_238,__y_00);
        f_1.exception =
             (Exception *)
             std::
             multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
             ::
             insert<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>
                       ((multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
                         *)&(pSVar2->content).size_,&local_298);
        std::pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>::~pair
                  (&local_298);
        kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>::~Own
                  ((Own<capnp::compiler::Compiler::Alias,_std::nullptr_t> *)local_1c0);
      }
      else {
        if (uVar6 - 2 < 2) goto LAB_006d75a5;
        if (uVar6 != 4) {
          if (uVar6 == 5) goto LAB_006d75a5;
          if (2 < uVar6 - 6) {
            if (uVar6 == 9) goto LAB_006d75a5;
            if (uVar6 != 10) {
              if (uVar6 == 0xb) goto LAB_006d75a5;
              if (1 < uVar6 - 0xc) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                          ((Fault *)&workspace,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                           ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                           (char (*) [25])"unknown declaration type",(Reader *)&subNode.ptr);
                kj::_::Debug::Fault::fatal((Fault *)&workspace);
              }
            }
          }
        }
      }
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                    *)local_c0);
    }
    Content::advanceState((Content *)local_40,EXPANDED);
    break;
  case 1:
    break;
  case 2:
    goto switchD_006d7388_caseD_2;
  case 3:
    goto switchD_006d7388_caseD_3;
  default:
    goto switchD_006d7388_default;
  }
  if (1 < (int)f.exception._4_4_) {
    pIVar15 = CompiledModule::getCompiler(params_00->module);
    pWVar16 = Compiler::Impl::getWorkspace(pIVar15);
    Orphanage::newOrphan<capnp::schema::Node>
              ((Orphan<capnp::schema::Node> *)&builder._builder.dataSize,&pWVar16->orphanage);
    Orphan<capnp::schema::Node>::get
              ((BuilderFor<capnp::schema::Node> *)local_2f8,
               (Orphan<capnp::schema::Node> *)&builder._builder.dataSize);
    capnp::schema::Node::Builder::setId((Builder *)local_2f8,params_00->id);
    Text::Reader::Reader((Reader *)&_lastDot537.field_1,&params_00->displayName);
    capnp::schema::Node::Builder::setDisplayName
              ((Builder *)local_2f8,(Reader)stack0xfffffffffffffcf8);
    kj::StringPtr::findLast((StringPtr *)&lastDot,(char)minimumState + 'P');
    pNVar8 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&lastDot);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_318,pNVar8);
    kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&lastDot);
    puVar9 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_318);
    if (puVar9 != (unsigned_long *)0x0) {
      _lastColon540.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
           kj::_::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_318)
      ;
      capnp::schema::Node::Builder::setDisplayNamePrefixLength
                ((Builder *)local_2f8,*(int *)_lastColon540.field_1 + 1);
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_318);
    kj::StringPtr::findLast((StringPtr *)&lastColon,(char)minimumState + 'P');
    pNVar8 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&lastColon);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_340,pNVar8);
    kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&lastColon);
    puVar9 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_340);
    if (puVar9 != (unsigned_long *)0x0) {
      puVar9 = kj::_::NullableValue<unsigned_long>::operator*
                         ((NullableValue<unsigned_long> *)local_340);
      uVar1 = *puVar9;
      uVar5 = capnp::schema::Node::Builder::getDisplayNamePrefixLength((Builder *)local_2f8);
      if (uVar5 < uVar1) {
        capnp::schema::Node::Builder::setDisplayNamePrefixLength
                  ((Builder *)local_2f8,(int)*puVar9 + 1);
      }
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_340);
    pNVar10 = kj::_::readMaybe<capnp::compiler::Compiler::Node>(&params_00->parent);
    if (pNVar10 != (Node *)0x0) {
      capnp::schema::Node::Builder::setScopeId((Builder *)local_2f8,pNVar10->id);
    }
    sVar11 = kj::Vector<capnp::compiler::Compiler::Node_*>::size
                       ((Vector<capnp::compiler::Compiler::Node_*> *)
                        &(local_40->description).content.disposer);
    capnp::schema::Node::Builder::initNestedNodes
              ((Builder *)&nestedIter.index,(Builder *)local_2f8,(uint)sVar11);
    IVar18 = List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder::begin
                       ((Builder *)&nestedIter.index);
    __range3_1 = (Vector<capnp::compiler::Compiler::Node_*> *)IVar18.container;
    local_3a8 = IVar18.index;
    __begin3_1 = (Node **)&(local_40->description).content.disposer;
    local_3a0 = (undefined1  [8])__range3_1;
    nestedIter.container._0_4_ = local_3a8;
    __end3_1 = kj::Vector<capnp::compiler::Compiler::Node_*>::begin
                         ((Vector<capnp::compiler::Compiler::Node_*> *)__begin3_1);
    node = (Node *)kj::Vector<capnp::compiler::Compiler::Node_*>::end
                             ((Vector<capnp::compiler::Compiler::Node_*> *)__begin3_1);
    for (; (Node *)__end3_1 != node; __end3_1 = __end3_1 + 1) {
      local_3d0.PointerType = *__end3_1;
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->(&local_3f8,
                   (IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
                    *)local_3a0);
      pBVar12 = capnp::_::TemporaryPointer<capnp::schema::Node::NestedNode::Builder>::operator->
                          (&local_3f8);
      Declaration::Reader::getName(&local_438,(Reader *)((long)local_3d0.PointerType + 0x18));
      AVar19 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_438);
      local_408 = AVar19;
      capnp::schema::Node::NestedNode::Builder::setName(pBVar12,(Reader)AVar19);
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->(&local_460,
                   (IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
                    *)local_3a0);
      pBVar12 = capnp::_::TemporaryPointer<capnp::schema::Node::NestedNode::Builder>::operator->
                          (&local_460);
      capnp::schema::Node::NestedNode::Builder::setId
                (pBVar12,*(uint64_t *)((long)local_3d0.PointerType + 0x48));
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator++((IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
                    *)local_3a0);
    }
    pEVar14 = CompiledModule::getErrorReporter(params_00->module);
    params_3 = kj::mv<capnp::Orphan<capnp::schema::Node>>
                         ((Orphan<capnp::schema::Node> *)&builder._builder.dataSize);
    pIVar15 = CompiledModule::getCompiler(params_00->module);
    _exception566.field_1._399_1_ = Compiler::Impl::shouldCompileAnnotations(pIVar15);
    params_1_00 = (Exception *)
                  kj::Arena::
                  allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                            (&pWVar16->arena,params_00,pEVar14,&params_00->declaration,params_3,
                             (bool *)((long)&_exception566.field_1 + 399));
    local_40->trace[4] = params_1_00;
    exception = local_40;
    local_7a0 = pWVar16;
    kj::
    runCatchingExceptions<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__1>
              (&local_798,(kj *)&exception,func);
    other = kj::_::readMaybe<kj::Exception>(&local_798);
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)local_600,other);
    kj::Maybe<kj::Exception>::~Maybe(&local_798);
    pEVar13 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_600);
    if (pEVar13 != (Exception *)0x0) {
      local_7b0 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_600);
      kj::Maybe<capnp::Schema>::operator=((Maybe<capnp::Schema> *)(local_40->trace + 5));
      pEVar14 = CompiledModule::getErrorReporter(params_00->module);
      uVar6 = (*pEVar14->_vptr_ErrorReporter[1])();
      if ((uVar6 & 1) == 0) {
        kj::str<char_const(&)[60],kj::Exception&>
                  ((String *)(local_7f0 + 0x10),
                   (kj *)"Internal compiler bug: Bootstrap schema failed validation:\n",
                   (char (*) [60])local_7b0,params_1_00);
        kj::StringPtr::StringPtr((StringPtr *)&local_7c8,(String *)(local_7f0 + 0x10));
        addError(params_00,(StringPtr)local_7c8);
        kj::String::~String((String *)(local_7f0 + 0x10));
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_600);
    nodeSet.sourceInfo.disposer = (ArrayDisposer *)local_40;
    kj::
    defer<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>
              ((kj *)local_7f0,(Type *)&nodeSet.sourceInfo.disposer);
    kj::Arena::
    copy<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              (&pWVar16->arena,
               (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
                *)local_7f0);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:578:38)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
                 *)local_7f0);
    Content::advanceState((Content *)local_40,BOOTSTRAP);
    Orphan<capnp::schema::Node>::~Orphan((Orphan<capnp::schema::Node> *)&builder._builder.dataSize);
switchD_006d7388_caseD_2:
    if (2 < (int)f.exception._4_4_) {
      NodeTranslator::NodeSet::NodeSet((NodeSet *)local_858);
      bVar3 = kj::Maybe<capnp::Schema>::operator==((Maybe<capnp::Schema> *)(local_40->trace + 5));
      if (bVar3) {
        pEVar14 = CompiledModule::getErrorReporter(params_00->module);
        iVar7 = (*pEVar14->_vptr_ErrorReporter[1])();
        f_2.exception._5_1_ = (byte)iVar7 & 1;
        f_2.exception._6_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (bool *)((long)&f_2.exception + 5));
        bVar3 = kj::_::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_2.exception + 6));
        if (!bVar3) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    (&local_868,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                     ,0x253,FAILED,"module->getErrorReporter().hadErrors()","_kjCondition,",
                     (DebugExpression<bool> *)((long)&f_2.exception + 6));
          kj::_::Debug::Fault::fatal(&local_868);
        }
        NodeTranslator::getBootstrapNode(&local_8c8,(NodeTranslator *)local_40->trace[4]);
        NodeTranslator::NodeSet::operator=((NodeSet *)local_858,&local_8c8);
        NodeTranslator::NodeSet::~NodeSet(&local_8c8);
      }
      else {
        this_00 = (NodeTranslator *)local_40->trace[4];
        pIVar15 = CompiledModule::getCompiler(params_00->module);
        pWVar16 = Compiler::Impl::getWorkspace(pIVar15);
        selfBootstrapSchema = SchemaLoader::getUnbound(&pWVar16->bootstrapLoader,params_00->id);
        NodeTranslator::finish(&local_928,this_00,selfBootstrapSchema);
        NodeTranslator::NodeSet::operator=((NodeSet *)local_858,&local_928);
        NodeTranslator::NodeSet::~NodeSet(&local_928);
      }
      kj::Maybe<capnp::schema::Node::Reader>::operator=
                ((Maybe<capnp::schema::Node::Reader> *)(local_40->trace + 7),(Reader *)local_858);
      other_00 = kj::mv<kj::Array<capnp::schema::Node::Reader>>
                           ((Array<capnp::schema::Node::Reader> *)&nodeSet.node._reader.nestingLimit
                           );
      kj::Array<capnp::schema::Node::Reader>::operator=
                ((Array<capnp::schema::Node::Reader> *)(local_40->trace + 0xe),other_00);
      other_01 = kj::mv<kj::Array<capnp::schema::Node::SourceInfo::Reader>>
                           ((Array<capnp::schema::Node::SourceInfo::Reader> *)
                            &nodeSet.auxNodes.disposer);
      kj::Array<capnp::schema::Node::SourceInfo::Reader>::operator=
                ((Array<capnp::schema::Node::SourceInfo::Reader> *)(local_40->trace + 0x11),other_01
                );
      Content::advanceState((Content *)local_40,FINISHED);
      NodeTranslator::NodeSet::~NodeSet((NodeSet *)local_858);
switchD_006d7388_caseD_3:
    }
  }
switchD_006d7388_default:
  kj::Maybe<capnp::compiler::Compiler::Node::Content_&>::Maybe
            ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)this,(Content *)local_40);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:476:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:476:3)>
               *)local_68);
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return kj::none;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } KJ_FALLTHROUGH;

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_SOME(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(lastDot + 1);
      }
      KJ_IF_SOME(lastColon, displayName.findLast(':')) {
        if (lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(lastColon + 1);
        }
      }
      KJ_IF_SOME(p, parent) {
        builder.setScopeId(p.id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = kj::none;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = kj::none;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } KJ_FALLTHROUGH;

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      NodeTranslator::NodeSet nodeSet;
      if (content.bootstrapSchema == kj::none) {
        // Must have failed in an earlier stage.
        KJ_ASSERT(module->getErrorReporter().hadErrors());
        nodeSet = content.translator->getBootstrapNode();
      } else {
        nodeSet = content.translator->finish(
            module->getCompiler().getWorkspace().bootstrapLoader.getUnbound(id));
      }

      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } KJ_FALLTHROUGH;

    case Content::FINISHED:
      break;
  }

  return content;
}